

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O0

int xmlNanoFTPCwd(void *ctx,char *directory)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  int res;
  int len;
  char buf [400];
  xmlNanoFTPCtxtPtr ctxt;
  char *directory_local;
  void *ctx_local;
  
  if ((ctx == (void *)0x0) || (*(int *)((long)ctx + 0x44) == -1)) {
    ctx_local._4_4_ = -1;
  }
  else if (directory == (char *)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    buf._392_8_ = ctx;
    snprintf((char *)&res,400,"CWD %s\r\n");
    buf[0x187] = '\0';
    sVar2 = strlen((char *)&res);
    sVar3 = send(*(int *)(buf._392_8_ + 0x44),&res,(long)(int)sVar2,0);
    ctx_local._4_4_ = (int)sVar3;
    if (ctx_local._4_4_ < 0) {
      __xmlIOErr(9,0,"send failed");
    }
    else {
      iVar1 = xmlNanoFTPGetResponse((void *)buf._392_8_);
      if (iVar1 == 4) {
        ctx_local._4_4_ = -1;
      }
      else if (iVar1 == 2) {
        ctx_local._4_4_ = 1;
      }
      else if (iVar1 == 5) {
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int
xmlNanoFTPCwd(void *ctx, const char *directory) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    char buf[400];
    int len;
    int res;

    if ((ctxt == NULL) || (ctxt->controlFd == INVALID_SOCKET)) return(-1);
    if (directory == NULL) return 0;

    /*
     * Expected response code for CWD:
     *
     * CWD
     *     250
     *     500, 501, 502, 421, 530, 550
     */
    snprintf(buf, sizeof(buf), "CWD %s\r\n", directory);
    buf[sizeof(buf) - 1] = 0;
    len = strlen(buf);
#ifdef DEBUG_FTP
    xmlGenericError(xmlGenericErrorContext, "%s", buf);
#endif
    res = send(ctxt->controlFd, SEND_ARG2_CAST buf, len, 0);
    if (res < 0) {
	__xmlIOErr(XML_FROM_FTP, 0, "send failed");
	return(res);
    }
    res = xmlNanoFTPGetResponse(ctxt);
    if (res == 4) {
	return(-1);
    }
    if (res == 2) return(1);
    if (res == 5) {
	return(0);
    }
    return(0);
}